

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

void vector_push_front(vector v,void *element)

{
  void *__src;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *__dest;
  
  uVar2 = (ulong)(v == (vector)0x0);
  if (element != (void *)0x0 && v != (vector)0x0) {
    if ((v->size == v->capacity) && (iVar1 = vector_reserve(v,v->capacity * 2), iVar1 != 0)) {
      log_write_impl_va("metacall",0x168,"vector_push_front",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector reserve error",uVar2);
    }
    uVar2 = v->type_size;
    __src = v->data;
    if (__src == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      uVar3 = v->capacity * uVar2;
      __dest = (void *)0x0;
      if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
        __dest = (void *)((long)__src + uVar2);
      }
    }
    memmove(__dest,__src,uVar2 * v->size);
    memcpy(v->data,element,v->type_size);
    v->size = v->size + 1;
  }
  return;
}

Assistant:

void vector_push_front(vector v, void *element)
{
	if (v != NULL && element != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		memmove(vector_data_offset_bytes(v, v->type_size), v->data, v->size * v->type_size);

		memcpy(v->data, element, v->type_size);

		++v->size;
	}
}